

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_meshb_size(FILE *file,REF_INT version,REF_SIZE *value)

{
  size_t sVar1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  unsigned_long long_value;
  REF_SIZE *pRStack_28;
  uint int_value;
  REF_SIZE *value_local;
  FILE *pFStack_18;
  REF_INT version_local;
  FILE *file_local;
  
  pRStack_28 = value;
  value_local._4_4_ = version;
  pFStack_18 = file;
  if (version < 4) {
    sVar1 = fread((void *)((long)&long_value + 4),4,1,(FILE *)file);
    if (sVar1 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x5e2,"ref_import_meshb_size","int value",1,sVar1);
      return 1;
    }
    *pRStack_28 = (ulong)long_value._4_4_;
  }
  else {
    sVar1 = fread(&ref_private_status_reis_ai,8,1,(FILE *)file);
    if (sVar1 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x5e5,"ref_import_meshb_size","long value",1,sVar1);
      return 1;
    }
    *pRStack_28 = ref_private_status_reis_ai;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_import_meshb_size(FILE *file, REF_INT version,
                                                REF_SIZE *value) {
  unsigned int int_value;
  unsigned long long_value;
  if (version < 4) {
    REIS(1, fread(&int_value, sizeof(int), 1, file), "int value");
    *value = (REF_SIZE)int_value;
  } else {
    REIS(1, fread(&long_value, sizeof(long), 1, file), "long value");
    *value = (REF_SIZE)long_value;
  }
  return REF_SUCCESS;
}